

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadGeometryVertexBuffer
          (OgreXmlSerializer *this,VertexDataXml *dest)

{
  string *psVar1;
  pointer *ppaVar2;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *pvVar3;
  pointer pvVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Logger *pLVar13;
  undefined7 uVar16;
  ulong uVar14;
  runtime_error *prVar15;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  iterator iVar21;
  ulong uVar22;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *pvVar23;
  long lVar24;
  float fVar25;
  aiVector3D uv;
  uint local_200;
  long *local_1f0 [2];
  long local_1e0 [2];
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_1c0;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_1b8;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_1b0;
  undefined1 local_1a8 [8];
  float local_1a0;
  undefined1 local_198 [96];
  ios_base local_138 [264];
  
  iVar12 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"positions");
  if (CONCAT44(extraout_var,iVar12) == 0) {
    bVar8 = false;
  }
  else {
    bVar8 = ReadAttribute<bool>(this,"positions");
  }
  iVar12 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"normals");
  if (CONCAT44(extraout_var_00,iVar12) == 0) {
    bVar9 = false;
  }
  else {
    bVar9 = ReadAttribute<bool>(this,"normals");
  }
  iVar12 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"tangents");
  local_200 = 0;
  if (CONCAT44(extraout_var_01,iVar12) == 0) {
    bVar10 = false;
  }
  else {
    bVar10 = ReadAttribute<bool>(this,"tangents");
  }
  iVar12 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"texture_coords");
  if (CONCAT44(extraout_var_02,iVar12) != 0) {
    local_200 = ReadAttribute<unsigned_int>(this,"texture_coords");
  }
  if (bVar8 == false) {
    bVar11 = VertexDataXml::HasPositions(dest);
    if (!bVar11) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Vertex buffer does not contain positions!","");
      std::runtime_error::runtime_error(prVar15,(string *)local_1a8);
      *(undefined ***)prVar15 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pLVar13 = DefaultLogger::get();
    Logger::debug(pLVar13,"    - Contains positions");
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&dest->positions,(ulong)(dest->super_IVertexData).count);
  }
  if (bVar9 != false) {
    pLVar13 = DefaultLogger::get();
    Logger::debug(pLVar13,"    - Contains normals");
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&dest->normals,(ulong)(dest->super_IVertexData).count);
  }
  if (bVar10 != false) {
    pLVar13 = DefaultLogger::get();
    Logger::debug(pLVar13,"    - Contains tangents");
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&dest->tangents,(ulong)(dest->super_IVertexData).count);
  }
  if (local_200 != 0) {
    pLVar13 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[16]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [16])"    - Contains ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," texture coords",0xf);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar13,(char *)local_1f0[0]);
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0],local_1e0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::
    vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ::resize(&dest->uvs,(ulong)local_200);
    lVar19 = (long)(dest->uvs).
                   super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(dest->uvs).
                   super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar19 != 0) {
      lVar19 = (lVar19 >> 3) * -0x5555555555555555;
      lVar19 = lVar19 + (ulong)(lVar19 == 0);
      lVar24 = 0;
      do {
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   ((long)&(((dest->uvs).
                             super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + lVar24),
                   (ulong)(dest->super_IVertexData).count);
        lVar24 = lVar24 + 0x18;
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
    }
  }
  NextNode_abi_cxx11_(this);
  psVar1 = &this->m_currentNodeName;
  local_1c0 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&dest->tangents;
  local_1b8 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&dest->normals;
  local_1b0 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&dest->positions;
  uVar16 = (undefined7)((ulong)local_1b0 >> 8);
  local_1c4 = (uint)CONCAT71(uVar16,1);
  local_1c8 = (uint)CONCAT71(uVar16,1);
  local_1cc = (uint)CONCAT71(uVar16,1);
  do {
    while( true ) {
      iVar12 = std::__cxx11::string::compare((char *)psVar1);
      if (((((iVar12 != 0) && (iVar12 = std::__cxx11::string::compare((char *)psVar1), iVar12 != 0))
           && (iVar12 = std::__cxx11::string::compare((char *)psVar1), iVar12 != 0)) &&
          ((iVar12 = std::__cxx11::string::compare((char *)psVar1), iVar12 != 0 &&
           (iVar12 = std::__cxx11::string::compare((char *)psVar1), iVar12 != 0)))) &&
         ((iVar12 = std::__cxx11::string::compare((char *)psVar1), iVar12 != 0 &&
          ((iVar12 = std::__cxx11::string::compare((char *)psVar1), iVar12 != 0 &&
           (iVar12 = std::__cxx11::string::compare((char *)psVar1), iVar12 != 0)))))) {
        uVar14 = (ulong)(dest->super_IVertexData).count;
        if (((long)(dest->positions).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(dest->positions).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - uVar14 !=
            0) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Read only ",10);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," positions when should have read ",0x21);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar15,(string *)local_1f0);
          *(undefined ***)prVar15 = &PTR__runtime_error_0082bce0;
          __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((bVar9 != false) &&
           (((long)(dest->normals).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(dest->normals).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - uVar14 !=
            0)) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Read only ",10);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," normals when should have read ",0x1f);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar15,(string *)local_1f0);
          *(undefined ***)prVar15 = &PTR__runtime_error_0082bce0;
          __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((bVar10 != false) &&
           (((long)(dest->tangents).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(dest->tangents).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - uVar14 !=
            0)) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Read only ",10);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," tangents when should have read ",0x20);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar15,(string *)local_1f0);
          *(undefined ***)prVar15 = &PTR__runtime_error_0082bce0;
          __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        pvVar4 = (dest->uvs).
                 super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar19 = (long)(dest->uvs).
                       super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4;
        if (lVar19 != 0) {
          uVar18 = (lVar19 >> 3) * -0x5555555555555555;
          uVar20 = 0;
          uVar22 = 1;
          do {
            if (((long)pvVar4[uVar20].
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 *(long *)&pvVar4[uVar20].
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data >> 2) * -0x5555555555555555 - uVar14 !=
                0) {
              prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Read only ",10);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," uvs for uv index ",0x12);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," when should have read ",0x17);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar15,(string *)local_1f0);
              *(undefined ***)prVar15 = &PTR__runtime_error_0082bce0;
              __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            bVar8 = uVar22 <= uVar18;
            lVar19 = uVar18 - uVar22;
            uVar20 = uVar22;
            uVar22 = (ulong)((int)uVar22 + 1);
          } while (bVar8 && lVar19 != 0);
        }
        return;
      }
      iVar12 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar12 == 0) {
        NextNode_abi_cxx11_(this);
      }
      if ((bVar8 == false) || (iVar12 = std::__cxx11::string::compare((char *)psVar1), iVar12 != 0))
      break;
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = 0.0;
      fVar25 = ReadAttribute<float>(this,"x");
      local_1a8._0_4_ = fVar25;
      fVar25 = ReadAttribute<float>(this,"y");
      local_1a8._4_4_ = fVar25;
      local_1a0 = ReadAttribute<float>(this,"z");
      iVar21._M_current =
           (dest->positions).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pvVar23 = local_1b0;
      if (iVar21._M_current ==
          (dest->positions).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
LAB_004bed47:
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>(pvVar23,iVar21,(aiVector3t<float> *)local_1a8);
      }
      else {
        (iVar21._M_current)->z = local_1a0;
        (iVar21._M_current)->x = (float)local_1a8._0_4_;
        (iVar21._M_current)->y = (float)local_1a8._4_4_;
        ppaVar2 = &(dest->positions).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar2 = *ppaVar2 + 1;
      }
LAB_004bed51:
      NextNode_abi_cxx11_(this);
    }
    if ((bVar9 != false) && (iVar12 = std::__cxx11::string::compare((char *)psVar1), iVar12 == 0)) {
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = 0.0;
      fVar25 = ReadAttribute<float>(this,"x");
      local_1a8._0_4_ = fVar25;
      fVar25 = ReadAttribute<float>(this,"y");
      local_1a8._4_4_ = fVar25;
      local_1a0 = ReadAttribute<float>(this,"z");
      iVar21._M_current =
           (dest->normals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pvVar23 = local_1b8;
      if (iVar21._M_current ==
          (dest->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_004bed47;
      (iVar21._M_current)->z = local_1a0;
      (iVar21._M_current)->x = (float)local_1a8._0_4_;
      (iVar21._M_current)->y = (float)local_1a8._4_4_;
      ppaVar2 = &(dest->normals).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar2 = *ppaVar2 + 1;
      goto LAB_004bed51;
    }
    if ((bVar10 != false) && (iVar12 = std::__cxx11::string::compare((char *)psVar1), iVar12 == 0))
    {
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = 0.0;
      fVar25 = ReadAttribute<float>(this,"x");
      local_1a8._0_4_ = fVar25;
      fVar25 = ReadAttribute<float>(this,"y");
      local_1a8._4_4_ = fVar25;
      local_1a0 = ReadAttribute<float>(this,"z");
      iVar21._M_current =
           (dest->tangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pvVar23 = local_1c0;
      if (iVar21._M_current ==
          (dest->tangents).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) goto LAB_004bed47;
      (iVar21._M_current)->z = local_1a0;
      (iVar21._M_current)->x = (float)local_1a8._0_4_;
      (iVar21._M_current)->y = (float)local_1a8._4_4_;
      ppaVar2 = &(dest->tangents).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar2 = *ppaVar2 + 1;
      goto LAB_004bed51;
    }
    if ((local_200 == 0) || (iVar12 = std::__cxx11::string::compare((char *)psVar1), iVar12 != 0)) {
      iVar12 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar12 == 0) {
        uVar17 = local_1c4;
        uVar5 = local_1cc;
        uVar6 = local_1c8;
        uVar7 = local_1c4 & 0xff;
        if ((local_1c4 & 1) != 0) {
          uVar7 = 0;
        }
      }
      else {
        iVar12 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar12 == 0) {
          uVar17 = local_1c8;
          uVar5 = local_1cc;
          uVar6 = local_1c8 & 0xff;
          uVar7 = local_1c4;
          if ((local_1c8 & 1) != 0) {
            uVar6 = 0;
          }
        }
        else {
          iVar12 = std::__cxx11::string::compare((char *)psVar1);
          uVar17 = 1;
          uVar5 = local_1cc;
          uVar6 = local_1c8;
          uVar7 = local_1c4;
          if ((iVar12 == 0) && (uVar17 = local_1cc, uVar5 = local_1cc & 0xff, (local_1cc & 1) != 0))
          {
            uVar5 = 0;
          }
        }
      }
      local_1c4 = uVar7;
      local_1c8 = uVar6;
      local_1cc = uVar5;
      if ((uVar17 & 1) != 0) {
        pLVar13 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[59]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [59])"Vertex buffer attribute read not implemented for element: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(this->m_currentNodeName)._M_dataplus._M_p,
                   (this->m_currentNodeName)._M_string_length);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar13,(char *)local_1f0[0]);
        if (local_1f0[0] != local_1e0) {
          operator_delete(local_1f0[0],local_1e0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      goto LAB_004bed51;
    }
    pvVar3 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
             (dest->uvs).
             super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar23 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                   (dest->uvs).
                   super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar23 != pvVar3;
        pvVar23 = pvVar23 + 0x18) {
      iVar12 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar12 != 0) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1a8 = (undefined1  [8])local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,
                   "Vertex buffer declared more UVs than can be found in a vertex","");
        std::runtime_error::runtime_error(prVar15,(string *)local_1a8);
        *(undefined ***)prVar15 = &PTR__runtime_error_0082bce0;
        __cxa_throw(prVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = 0.0;
      fVar25 = ReadAttribute<float>(this,"u");
      local_1a8._0_4_ = fVar25;
      fVar25 = ReadAttribute<float>(this,"v");
      local_1a8._4_4_ = 1.0 - fVar25;
      iVar21._M_current = *(aiVector3t<float> **)(pvVar23 + 8);
      if (iVar21._M_current == *(aiVector3t<float> **)(pvVar23 + 0x10)) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>(pvVar23,iVar21,(aiVector3t<float> *)local_1a8);
      }
      else {
        (iVar21._M_current)->z = local_1a0;
        (iVar21._M_current)->x = (float)local_1a8._0_4_;
        (iVar21._M_current)->y = 1.0 - fVar25;
        *(long *)(pvVar23 + 8) = *(long *)(pvVar23 + 8) + 0xc;
      }
      NextNode_abi_cxx11_(this);
    }
  } while( true );
}

Assistant:

void OgreXmlSerializer::ReadGeometryVertexBuffer(VertexDataXml *dest)
{
    bool positions = (HasAttribute("positions") && ReadAttribute<bool>("positions"));
    bool normals   = (HasAttribute("normals") && ReadAttribute<bool>("normals"));
    bool tangents  = (HasAttribute("tangents") && ReadAttribute<bool>("tangents"));
    uint32_t uvs   = (HasAttribute("texture_coords") ? ReadAttribute<uint32_t>("texture_coords") : 0);

    // Not having positions is a error only if a previous vertex buffer did not have them.
    if (!positions && !dest->HasPositions()) {
        throw DeadlyImportError("Vertex buffer does not contain positions!");
    }

    if (positions)
    {
        ASSIMP_LOG_DEBUG("    - Contains positions");
        dest->positions.reserve(dest->count);
    }
    if (normals)
    {
        ASSIMP_LOG_DEBUG("    - Contains normals");
        dest->normals.reserve(dest->count);
    }
    if (tangents)
    {
        ASSIMP_LOG_DEBUG("    - Contains tangents");
        dest->tangents.reserve(dest->count);
    }
    if (uvs > 0)
    {
        ASSIMP_LOG_DEBUG_F( "    - Contains ", uvs, " texture coords");
        dest->uvs.resize(uvs);
        for(size_t i=0, len=dest->uvs.size(); i<len; ++i) {
            dest->uvs[i].reserve(dest->count);
        }
    }

    bool warnBinormal = true;
    bool warnColorDiffuse = true;
    bool warnColorSpecular = true;

    NextNode();

    while(m_currentNodeName == nnVertex       ||
          m_currentNodeName == nnPosition     ||
          m_currentNodeName == nnNormal       ||
          m_currentNodeName == nnTangent      ||
          m_currentNodeName == nnBinormal     ||
          m_currentNodeName == nnTexCoord     ||
          m_currentNodeName == nnColorDiffuse ||
          m_currentNodeName == nnColorSpecular)
    {
        if (m_currentNodeName == nnVertex) {
            NextNode();
        }

        /// @todo Implement nnBinormal, nnColorDiffuse and nnColorSpecular

        if (positions && m_currentNodeName == nnPosition)
        {
            aiVector3D pos;
            pos.x = ReadAttribute<float>(anX);
            pos.y = ReadAttribute<float>(anY);
            pos.z = ReadAttribute<float>(anZ);
            dest->positions.push_back(pos);
        }
        else if (normals && m_currentNodeName == nnNormal)
        {
            aiVector3D normal;
            normal.x = ReadAttribute<float>(anX);
            normal.y = ReadAttribute<float>(anY);
            normal.z = ReadAttribute<float>(anZ);
            dest->normals.push_back(normal);
        }
        else if (tangents && m_currentNodeName == nnTangent)
        {
            aiVector3D tangent;
            tangent.x = ReadAttribute<float>(anX);
            tangent.y = ReadAttribute<float>(anY);
            tangent.z = ReadAttribute<float>(anZ);
            dest->tangents.push_back(tangent);
        }
        else if (uvs > 0 && m_currentNodeName == nnTexCoord)
        {
            for(auto &uvs : dest->uvs)
            {
                if (m_currentNodeName != nnTexCoord) {
                    throw DeadlyImportError("Vertex buffer declared more UVs than can be found in a vertex");
                }

                aiVector3D uv;
                uv.x = ReadAttribute<float>("u");
                uv.y = (ReadAttribute<float>("v") * -1) + 1; // Flip UV from Ogre to Assimp form
                uvs.push_back(uv);

                NextNode();
            }
            // Continue main loop as above already read next node
            continue;
        }
        else
        {
            /// @todo Remove this stuff once implemented. We only want to log warnings once per element.
            bool warn = true;
            if (m_currentNodeName == nnBinormal)
            {
                if (warnBinormal)
                {
                    warnBinormal = false;
                }
                else
                {
                    warn = false;
                }
            }
            else if (m_currentNodeName == nnColorDiffuse)
            {
                if (warnColorDiffuse)
                {
                    warnColorDiffuse = false;
                }
                else
                {
                    warn = false;
                }
            }
            else if (m_currentNodeName == nnColorSpecular)
            {
                if (warnColorSpecular)
                {
                    warnColorSpecular = false;
                }
                else
                {
                    warn = false;
                }
            }
            if (warn) {
                ASSIMP_LOG_WARN_F("Vertex buffer attribute read not implemented for element: ", m_currentNodeName);
            }
        }

        // Advance
        NextNode();
    }

    // Sanity checks
    if (dest->positions.size() != dest->count) {
      throw DeadlyImportError(Formatter::format() << "Read only " << dest->positions.size() << " positions when should have read " << dest->count);
    }
    if (normals && dest->normals.size() != dest->count) {
        throw DeadlyImportError(Formatter::format() << "Read only " << dest->normals.size() << " normals when should have read " << dest->count);
    }
    if (tangents && dest->tangents.size() != dest->count) {
        throw DeadlyImportError(Formatter::format() << "Read only " << dest->tangents.size() << " tangents when should have read " << dest->count);
    }
    for(unsigned int i=0; i<dest->uvs.size(); ++i)
    {
        if (dest->uvs[i].size() != dest->count) {
            throw DeadlyImportError(Formatter::format() << "Read only " << dest->uvs[i].size()
                << " uvs for uv index " << i << " when should have read " << dest->count);
        }
    }
}